

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  bool bVar1;
  void *local_98;
  size_t local_58;
  size_t length;
  char_t *buffer;
  auto_deleter<void> contents_guard;
  xml_encoding buffer_encoding;
  bool own_local;
  bool is_mutable_local;
  uint options_local;
  size_t size_local;
  void *contents_local;
  xml_node_struct *root_local;
  xml_document_struct *doc_local;
  
  if ((contents == (void *)0x0) && (size != 0)) {
    make_parse_result(__return_storage_ptr__,status_io_error,0);
  }
  else {
    contents_guard.deleter._4_4_ = get_buffer_encoding(encoding,contents,size);
    local_98 = contents;
    if (!own) {
      local_98 = (void *)0x0;
    }
    auto_deleter<void>::auto_deleter
              ((auto_deleter<void> *)&buffer,local_98,
               (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate);
    length = 0;
    local_58 = 0;
    bVar1 = convert_buffer((char_t **)&length,&local_58,contents_guard.deleter._4_4_,contents,size,
                           is_mutable);
    if (bVar1) {
      auto_deleter<void>::release((auto_deleter<void> *)&buffer);
      if (((own) && ((void *)length != contents)) && (contents != (void *)0x0)) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (contents);
      }
      if ((own) || ((void *)length != contents)) {
        *out_buffer = (char_t *)length;
      }
      doc->buffer = (char_t *)length;
      xml_parser::parse(__return_storage_ptr__,(char_t *)length,local_58,doc,root,options);
      __return_storage_ptr__->encoding = contents_guard.deleter._4_4_;
    }
    else {
      make_parse_result(__return_storage_ptr__,status_out_of_memory,0);
    }
    auto_deleter<void>::~auto_deleter((auto_deleter<void> *)&buffer);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : 0, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}